

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::is_section_without_segment(elfio *this,uint section_index)

{
  elfio *peVar1;
  __uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_> _Var2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  peVar1 = (this->segments).parent;
  bVar7 = (*(int *)&(peVar1->segments_).
                    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(peVar1->segments_).
                    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x7fff8U) == 0;
  if (!bVar7) {
    uVar5 = 0;
    do {
      uVar4 = 0;
      while (uVar3 = (**(code **)(*(long *)(((this->segments).parent)->segments_).
                                           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                                           super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>
                                           ._M_t + 0xb0))(), uVar4 < uVar3) {
        _Var2._M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
        super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl =
             (((this->segments).parent)->segments_).
             super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
             super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t;
        uVar3 = (**(code **)(*(long *)_Var2._M_t.
                                      super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                                      .super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl +
                            0xb8))(_Var2._M_t.
                                   super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                                   .super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl,
                                   uVar4);
        uVar4 = uVar4 + 1;
        if (uVar3 == section_index) {
          return bVar7;
        }
      }
      uVar5 = uVar5 + 1;
      peVar1 = (this->segments).parent;
      bVar6 = uVar5 < ((uint)(*(int *)&(peVar1->segments_).
                                       super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                             *(int *)&(peVar1->segments_).
                                      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff);
      bVar7 = !bVar6;
    } while (bVar6);
  }
  return bVar7;
}

Assistant:

Elf_Half size() const
        {
            return static_cast<Elf_Half>( parent->segments_.size() );
        }